

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O3

void anon_unknown.dwarf_a8cbf4::ProcessMetadata
               (ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *set,
               ConversionData *conv,Metadata *properties,string *prefix,uint nest)

{
  undefined8 uVar1;
  long *plVar2;
  IfcProperty *pIVar3;
  long *plVar4;
  long lVar5;
  mapped_type *pmVar6;
  long lVar7;
  ostream *poVar8;
  long lVar9;
  size_type *psVar10;
  Out *v;
  ulong uVar11;
  ulong uVar12;
  pointer pLVar13;
  _func_int *p_Var14;
  string value_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_230 [32];
  _Rb_tree_node_base *local_210;
  ConversionData *local_208;
  char *local_200;
  long local_1f8;
  char local_1f0 [16];
  pointer local_1e0;
  uint local_1d4;
  string *local_1d0;
  Metadata *local_1c8;
  pointer local_1c0;
  ostream *local_1b8 [2];
  ostream local_1a8 [112];
  _Rb_tree_node_base a_Stack_138 [8];
  
  uVar12 = (ulong)nest;
  pLVar13 = (set->
            super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
            ).
            super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1c0 = (set->
              super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
              ).
              super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar13 != local_1c0) {
    local_210 = a_Stack_138;
    local_1d4 = (int)prefix + 1;
    local_208 = conv;
    local_1d0 = prefix;
    local_1c8 = properties;
    do {
      pIVar3 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProperty>(pLVar13->obj);
      lVar5 = *(long *)&(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
      if (lVar5 == 0) {
        lVar5 = *(long *)&(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                          field_0x10;
        local_230._0_8_ = local_230 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_230,lVar5,
                   *(long *)&(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>)
                             .field_0x18 + lVar5);
      }
      else {
        local_1b8[0] = local_1a8;
        lVar9 = *(long *)&(properties->_M_t)._M_impl;
        std::__cxx11::string::_M_construct<char*>((string *)local_1b8,lVar9,lVar5 + lVar9);
        std::__cxx11::string::append((char *)local_1b8);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_1b8,
                                    *(ulong *)&(pIVar3->
                                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>
                                               ).field_0x10);
        local_230._0_8_ = local_230 + 0x10;
        psVar10 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar10) {
          local_230._16_8_ = *psVar10;
          local_230._24_8_ = plVar4[3];
        }
        else {
          local_230._16_8_ = *psVar10;
          local_230._0_8_ = (size_type *)*plVar4;
        }
        local_230._8_8_ = plVar4[1];
        *plVar4 = (long)psVar10;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if (local_1b8[0] != local_1a8) {
          operator_delete(local_1b8[0]);
        }
      }
      p_Var14 = (_func_int *)
                ((long)&(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                        _vptr_ObjectHelper +
                (long)(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                      _vptr_ObjectHelper[-3]);
      lVar5 = __dynamic_cast(p_Var14,&Assimp::STEP::Object::typeinfo,
                             &Assimp::IFC::Schema_2x3::IfcPropertySingleValue::typeinfo,
                             0xffffffffffffffff);
      if (lVar5 == 0) {
        local_1e0 = pLVar13;
        lVar5 = __dynamic_cast(p_Var14,&Assimp::STEP::Object::typeinfo,
                               &Assimp::IFC::Schema_2x3::IfcPropertyListValue::typeinfo,
                               0xffffffffffffffff);
        if (lVar5 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
          plVar4 = *(long **)(lVar5 + 0x78);
          plVar2 = *(long **)(lVar5 + 0x80);
          if (plVar4 != plVar2) {
            uVar11 = 0;
            do {
              lVar9 = *plVar4;
              if (lVar9 != 0) {
                lVar7 = __dynamic_cast(lVar9,&Assimp::STEP::EXPRESS::DataType::typeinfo,
                                       &Assimp::STEP::EXPRESS::
                                        PrimitiveDataType<std::__cxx11::string>::typeinfo,0);
                if (lVar7 == 0) {
                  lVar7 = __dynamic_cast(lVar9,&Assimp::STEP::EXPRESS::DataType::typeinfo,
                                         &Assimp::STEP::EXPRESS::PrimitiveDataType<double>::typeinfo
                                         ,0);
                  if (lVar7 == 0) {
                    lVar9 = __dynamic_cast(lVar9,&Assimp::STEP::EXPRESS::DataType::typeinfo,
                                           &Assimp::STEP::EXPRESS::PrimitiveDataType<long>::typeinfo
                                           ,0);
                    if (lVar9 != 0) {
                      std::ostream::_M_insert<long>((long)local_1a8);
                    }
                  }
                  else {
                    std::ostream::_M_insert<double>((double)(float)*(double *)(lVar7 + 8));
                  }
                }
                else {
                  local_200 = local_1f0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_200,*(long *)(lVar7 + 8),
                             *(long *)(lVar7 + 0x10) + *(long *)(lVar7 + 8));
                  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\'",1);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     (local_1a8,local_200,local_1f8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'",1);
                  if (local_200 != local_1f0) {
                    operator_delete(local_200);
                  }
                }
                uVar11 = (ulong)((int)uVar11 + 1);
                if (uVar11 < (ulong)(*(long *)(lVar5 + 0x80) - *(long *)(lVar5 + 0x78) >> 4)) {
                  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
                }
              }
              plVar4 = plVar4 + 2;
            } while (plVar4 != plVar2);
          }
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
          std::__cxx11::stringbuf::str();
          properties = local_1c8;
          pLVar13 = local_1e0;
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_208,(key_type *)local_230);
          goto LAB_004bf4d8;
        }
        lVar5 = __dynamic_cast(p_Var14,&Assimp::STEP::Object::typeinfo,
                               &Assimp::IFC::Schema_2x3::IfcComplexProperty::typeinfo,
                               0xffffffffffffffff);
        pLVar13 = local_1e0;
        if (lVar5 == 0) {
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_208,(key_type *)local_230);
          uVar12 = 0;
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,0x71872f);
        }
        else if ((uint)local_1d0 < 3) {
          ProcessMetadata((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL>
                           *)(lVar5 + 0x88),local_208,(Metadata *)local_230,
                          (string *)(ulong)local_1d4,(uint)uVar12);
        }
        else {
          Assimp::LogFunctions<Assimp::IFCImporter>::LogError((char *)0x4bf3b2);
        }
      }
      else if (*(char *)(lVar5 + 0x88) == '\x01') {
        uVar1 = *(undefined8 *)(lVar5 + 0x78);
        lVar5 = __dynamic_cast(uVar1,&Assimp::STEP::EXPRESS::DataType::typeinfo,
                               &Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::string>::
                                typeinfo,0);
        if (lVar5 == 0) {
          lVar5 = __dynamic_cast(uVar1,&Assimp::STEP::EXPRESS::DataType::typeinfo,
                                 &Assimp::STEP::EXPRESS::PrimitiveDataType<double>::typeinfo,0);
          if (lVar5 == 0) {
            lVar5 = __dynamic_cast(uVar1,&Assimp::STEP::EXPRESS::DataType::typeinfo,
                                   &Assimp::STEP::EXPRESS::PrimitiveDataType<long>::typeinfo,0);
            if (lVar5 == 0) goto LAB_004bf517;
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::ostream::_M_insert<long>((long)local_1a8);
            std::__cxx11::stringbuf::str();
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_208,(key_type *)local_230);
          }
          else {
            local_1e0 = *(pointer *)(lVar5 + 8);
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::ostream::_M_insert<double>((double)(float)(double)local_1e0);
            std::__cxx11::stringbuf::str();
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_208,(key_type *)local_230);
          }
LAB_004bf4d8:
          std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_200);
          if (local_200 != local_1f0) {
            operator_delete(local_200);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base((ios_base *)local_210);
        }
        else {
          local_1b8[0] = local_1a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b8,*(long *)(lVar5 + 8),
                     *(long *)(lVar5 + 0x10) + *(long *)(lVar5 + 8));
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_208,(key_type *)local_230);
          std::__cxx11::string::_M_assign((string *)pmVar6);
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0]);
          }
        }
      }
LAB_004bf517:
      if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
        operator_delete((void *)local_230._0_8_);
      }
      pLVar13 = pLVar13 + 1;
    } while (pLVar13 != local_1c0);
  }
  return;
}

Assistant:

void ProcessMetadata(const Schema_2x3::ListOf< Schema_2x3::Lazy< Schema_2x3::IfcProperty >, 1, 0 >& set, ConversionData& conv, Metadata& properties,
        const std::string& prefix = "",
        unsigned int nest = 0) {
    for(const Schema_2x3::IfcProperty& property : set) {
        const std::string& key = prefix.length() > 0 ? (prefix + "." + property.Name) : property.Name;
        if (const Schema_2x3::IfcPropertySingleValue* const singleValue = property.ToPtr<Schema_2x3::IfcPropertySingleValue>()) {
            if (singleValue->NominalValue) {
                if (const ::Assimp::STEP::EXPRESS::STRING* str = singleValue->NominalValue.Get()->ToPtr<::Assimp::STEP::EXPRESS::STRING>()) {
                    std::string value = static_cast<std::string>(*str);
                    properties[key]=value;
                }
                else if (const ::Assimp::STEP::EXPRESS::REAL* val = singleValue->NominalValue.Get()->ToPtr<::Assimp::STEP::EXPRESS::REAL>()) {
                    float value = static_cast<float>(*val);
                    std::stringstream s;
                    s << value;
                    properties[key]=s.str();
                }
                else if (const ::Assimp::STEP::EXPRESS::INTEGER* val = singleValue->NominalValue.Get()->ToPtr<::Assimp::STEP::EXPRESS::INTEGER>()) {
                    int64_t value = static_cast<int64_t>(*val);
                    std::stringstream s;
                    s << value;
                    properties[key]=s.str();
                }
            }
        }
        else if (const Schema_2x3::IfcPropertyListValue* const listValue = property.ToPtr<Schema_2x3::IfcPropertyListValue>()) {
            std::stringstream ss;
            ss << "[";
            unsigned index=0;
            for(const Schema_2x3::IfcValue::Out& v : listValue->ListValues) {
                if (!v) continue;
                if (const ::Assimp::STEP::EXPRESS::STRING* str = v->ToPtr<::Assimp::STEP::EXPRESS::STRING>()) {
                    std::string value = static_cast<std::string>(*str);
                    ss << "'" << value << "'";
                }
                else if (const ::Assimp::STEP::EXPRESS::REAL* val = v->ToPtr<::Assimp::STEP::EXPRESS::REAL>()) {
                    float value = static_cast<float>(*val);
                    ss << value;
                }
                else if (const ::Assimp::STEP::EXPRESS::INTEGER* val = v->ToPtr<::Assimp::STEP::EXPRESS::INTEGER>()) {
                    int64_t value = static_cast<int64_t>(*val);
                    ss << value;
                }
                if (index+1<listValue->ListValues.size()) {
                    ss << ",";
                }
                index++;
            }
            ss << "]";
            properties[key]=ss.str();
        }
        else if (const Schema_2x3::IfcComplexProperty* const complexProp = property.ToPtr<Schema_2x3::IfcComplexProperty>()) {
            if(nest > 2) { // mostly arbitrary limit to prevent stack overflow vulnerabilities
                IFCImporter::LogError("maximum nesting level for IfcComplexProperty reached, skipping this property.");
            }
            else {
                ProcessMetadata(complexProp->HasProperties, conv, properties, key, nest + 1);
            }
        }
        else {
            properties[key]="";
        }
    }
}